

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

void __thiscall Lodtalk::StackPage::divorceAllFrames(StackPage *this)

{
  Oop OVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  intptr_t iVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  bool local_c1;
  StackFrame local_b8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_a8;
  anon_union_8_4_0eb573b0_for_Oop_0 local_a0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_98;
  Context *nextContext;
  Context *currentContext;
  uint8_t *local_80;
  undefined1 auStack_78 [8];
  StackFrame nextFrame;
  Context *headContext;
  StackFrame nextBaseFrame;
  uint8_t *local_38;
  undefined1 auStack_20 [8];
  StackFrame currentFrame;
  StackPage *this_local;
  
  auStack_20 = (undefined1  [8])(this->headFrame).framePointer;
  currentFrame.framePointer = (this->headFrame).stackPointer;
  currentFrame.stackPointer = (uint8_t *)this;
  while (auStack_20 != (undefined1  [8])0x0) {
    StackFrame::ensureHasUpdatedMarriedSpouse((StackFrame *)auStack_20,this->context);
    StackFrame::getPreviousFrame((StackFrame *)&nextBaseFrame.stackPointer);
    auStack_20 = (undefined1  [8])nextBaseFrame.stackPointer;
    currentFrame.framePointer = local_38;
    StackFrame::~StackFrame((StackFrame *)&nextBaseFrame.stackPointer);
  }
  local_c1 = false;
  if (this->nextPage != (StackPage *)0x0) {
    local_c1 = isInUse(this->nextPage);
  }
  if (local_c1 == false) {
    __assert_fail("nextPage && nextPage->isInUse()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0x32,"void Lodtalk::StackPage::divorceAllFrames()");
  }
  StackFrame::StackFrame((StackFrame *)&headContext,this->nextPage->baseFramePointer,(uint8_t *)0x0)
  ;
  paVar2 = &StackFrame::getThisContext(&this->headFrame)->field_0;
  OVar1.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar2->uintValue;
  iVar3 = StackFrame::getReturnPointer((StackFrame *)&headContext);
  aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(iVar3);
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)OVar1.field_0 + 0x10) = aVar4;
  StackFrame::~StackFrame((StackFrame *)&headContext);
  auStack_78 = (undefined1  [8])(this->headFrame).framePointer;
  nextFrame.framePointer = (this->headFrame).stackPointer;
  StackFrame::getPreviousFrame((StackFrame *)&currentContext);
  auStack_20 = (undefined1  [8])currentContext;
  currentFrame.framePointer = local_80;
  StackFrame::~StackFrame((StackFrame *)&currentContext);
  while (auStack_20 != (undefined1  [8])0x0) {
    paVar2 = &StackFrame::getThisContext((StackFrame *)auStack_20)->field_0;
    nextContext = (Context *)paVar2->header;
    paVar2 = &StackFrame::getThisContext((StackFrame *)auStack_78)->field_0;
    local_98 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar2->uintValue;
    local_a0 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer(nextContext);
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(local_98.uintValue + 8) = local_a0;
    iVar3 = StackFrame::getReturnPointer((StackFrame *)auStack_78);
    local_a8 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(iVar3);
    (nextContext->super_InstructionStream).pc.field_0 = local_a8;
    auStack_78 = auStack_20;
    nextFrame.framePointer = currentFrame.framePointer;
    StackFrame::getPreviousFrame(&local_b8);
    auStack_20 = (undefined1  [8])local_b8.framePointer;
    currentFrame.framePointer = local_b8.stackPointer;
    StackFrame::~StackFrame(&local_b8);
  }
  freed(this);
  StackFrame::~StackFrame((StackFrame *)auStack_78);
  StackFrame::~StackFrame((StackFrame *)auStack_20);
  return;
}

Assistant:

void StackPage::divorceAllFrames()
{
    // First pass. Ensure the frames are married and that they have their context updated.
    auto currentFrame = headFrame;
    while (currentFrame.framePointer != 0)
    {
        currentFrame.ensureHasUpdatedMarriedSpouse(context);
        currentFrame = currentFrame.getPreviousFrame();
    }

    // Get the head frame pc from the next page
    assert(nextPage && nextPage->isInUse());
    {
        StackFrame nextBaseFrame(nextPage->baseFramePointer);
        auto headContext = reinterpret_cast<Context*> (headFrame.getThisContext().pointer);
        headContext->pc = Oop::encodeSmallInteger(nextBaseFrame.getReturnPointer());
    }

    // Second pass. Divorce
    auto nextFrame = headFrame;
    currentFrame = headFrame.getPreviousFrame();
    while (currentFrame.framePointer != 0)
    {
        auto currentContext = reinterpret_cast<Context*> (currentFrame.getThisContext().pointer);
        auto nextContext = reinterpret_cast<Context*> (nextFrame.getThisContext().pointer);
        nextContext->sender = Oop::fromPointer(currentContext);
        currentContext->pc = Oop::encodeSmallInteger(nextFrame.getReturnPointer());

        nextFrame = currentFrame;
        currentFrame = currentFrame.getPreviousFrame();
    }

    freed();
}